

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

LPCWSTR __thiscall
Js::RecyclableCollectionObjectDisplay<Js::JavascriptWeakMap>::Value
          (RecyclableCollectionObjectDisplay<Js::JavascriptWeakMap> *this,int radix)

{
  StringBuilder<Memory::ArenaAllocator> *this_00;
  uint uVar1;
  ThreadContext *this_01;
  DebugManager *pDVar2;
  char16 *pcVar3;
  StringBuilder<Memory::ArenaAllocator> *builder;
  int radix_local;
  RecyclableCollectionObjectDisplay<Js::JavascriptWeakMap> *this_local;
  
  this_01 = ScriptContext::GetThreadContext(this->scriptContext);
  pDVar2 = ThreadContext::GetDebugManager(this_01);
  this_00 = pDVar2->pCurrentInterpreterLocation->stringBuilder;
  StringBuilder<Memory::ArenaAllocator>::Reset(this_00);
  StringBuilder<Memory::ArenaAllocator>::AppendCppLiteral<8ul>(this_00,(char16 (*) [8])L"size = ");
  uVar1 = (*(this->walker->super_IDiagObjectModelWalkerBase)._vptr_IDiagObjectModelWalkerBase[1])();
  StringBuilder<Memory::ArenaAllocator>::AppendUint64(this_00,(ulong)uVar1);
  pcVar3 = StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
  return pcVar3;
}

Assistant:

LPCWSTR RecyclableCollectionObjectDisplay<TData>::Value(int radix)
    {
        StringBuilder<ArenaAllocator>* builder = scriptContext->GetThreadContext()->GetDebugManager()->pCurrentInterpreterLocation->stringBuilder;
        builder->Reset();

        builder->AppendCppLiteral(_u("size = "));
        builder->AppendUint64(walker->GetChildrenCount());

        return builder->Detach();
    }